

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool anon_unknown.dwarf_14eae::VersionCompare(CompareOp op,char *lhss,char *rhss)

{
  CompareOp CVar1;
  ulong uVar2;
  ulong uVar3;
  char *endr;
  char *endl;
  char *local_30;
  char *local_28;
  
  local_30 = rhss;
  local_28 = lhss;
  while( true ) {
    if ((9 < (byte)(*local_28 - 0x30U)) && (9 < (byte)(*local_30 - 0x30U))) {
      CVar1 = OP_EQUAL;
      goto LAB_00117b2b;
    }
    uVar2 = strtoul(local_28,&local_28,10);
    uVar3 = strtoul(local_30,&local_30,10);
    if (uVar2 < uVar3) {
      CVar1 = OP_LESS;
      goto LAB_00117b2b;
    }
    if (uVar3 < uVar2) break;
    if (*local_30 == '.') {
      local_30 = local_30 + 1;
    }
    if (*local_28 == '.') {
      local_28 = local_28 + 1;
    }
  }
  CVar1 = OP_GREATER;
LAB_00117b2b:
  return (CVar1 & op) != 0;
}

Assistant:

bool VersionCompare(cmSystemTools::CompareOp op, const char* lhss,
                    const char* rhss)
{
  const char* endl = lhss;
  const char* endr = rhss;
  unsigned long lhs;
  unsigned long rhs;

  while (((*endl >= '0') && (*endl <= '9')) ||
         ((*endr >= '0') && (*endr <= '9'))) {
    // Do component-wise comparison.
    lhs = strtoul(endl, const_cast<char**>(&endl), 10);
    rhs = strtoul(endr, const_cast<char**>(&endr), 10);

    if (lhs < rhs) {
      // lhs < rhs, so true if operation is LESS
      return (op & cmSystemTools::OP_LESS) != 0;
    }
    if (lhs > rhs) {
      // lhs > rhs, so true if operation is GREATER
      return (op & cmSystemTools::OP_GREATER) != 0;
    }

    if (*endr == '.') {
      endr++;
    }

    if (*endl == '.') {
      endl++;
    }
  }
  // lhs == rhs, so true if operation is EQUAL
  return (op & cmSystemTools::OP_EQUAL) != 0;
}